

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QTabBar_*>::erase(QList<QTabBar_*> *this,const_iterator abegin,const_iterator aend)

{
  long lVar1;
  const_iterator __first;
  char *__filename;
  iterator iVar2;
  QList<QTabBar_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  qsizetype i;
  qsizetype in_stack_ffffffffffffff88;
  const_iterator in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __first = constBegin(in_RDI);
  __filename = (char *)std::distance<QList<QTabBar*>::const_iterator>
                                 (__first,in_stack_ffffffffffffffa0);
  std::distance<QList<QTabBar*>::const_iterator>(__first,in_stack_ffffffffffffffa0);
  remove(in_RDI,__filename);
  begin(in_RDI);
  iVar2 = iterator::operator+((iterator *)in_RDI,in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)iVar2.i;
  }
  __stack_chk_fail();
}

Assistant:

typename QList<T>::iterator QList<T>::erase(const_iterator abegin, const_iterator aend)
{
    Q_ASSERT_X(isValidIterator(abegin), "QList::erase", "The specified iterator argument 'abegin' is invalid");
    Q_ASSERT_X(isValidIterator(aend), "QList::erase", "The specified iterator argument 'aend' is invalid");
    Q_ASSERT(aend >= abegin);

    qsizetype i = std::distance(constBegin(), abegin);
    qsizetype n = std::distance(abegin, aend);
    remove(i, n);

    return begin() + i;
}